

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O2

bool __thiscall AInventory::Grind(AInventory *this,bool items)

{
  bool bVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,items) != 0) {
    if (((this->super_AActor).flags.Value & 0x20000) == 0) {
      bVar1 = AActor::Grind(&this->super_AActor,true);
      return bVar1;
    }
    if (((this->super_AActor).flags3.Value & 0x80000) == 0) {
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
    }
  }
  return false;
}

Assistant:

bool AInventory::Grind(bool items)
{
	// Does this grind request even care about items?
	if (!items)
	{
		return false;
	}
	// Dropped items are normally destroyed by crushers. Set the DONTGIB flag,
	// and they'll act like corpses with it set and be immune to crushers.
	if (flags & MF_DROPPED)
	{
		if (!(flags3 & MF3_DONTGIB))
		{
			Destroy();
		}
		return false;
	}
	// Non-dropped items call the super method for compatibility.
	return Super::Grind(items);
}